

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

void __thiscall OPL3::~OPL3(OPL3 *this)

{
  Operator *pOVar1;
  Channel2op *pCVar2;
  Channel4op *pCVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPL3_006ef240;
  this->ryt = 0;
  setRhythmMode(this);
  lVar6 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar7 = 0;
    do {
      pOVar1 = this->operators[lVar6][lVar7];
      if (pOVar1 != (Operator *)0x0) {
        operator_delete(pOVar1,0xb8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    lVar7 = 0;
    do {
      pCVar2 = this->channels2op[lVar6][lVar7];
      if (pCVar2 != (Channel2op *)0x0) {
        (*(pCVar2->super_Channel)._vptr_Channel[1])();
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    lVar7 = 0;
    do {
      pCVar3 = this->channels4op[lVar6][lVar7];
      if (pCVar3 != (Channel4op *)0x0) {
        (*(pCVar3->super_Channel)._vptr_Channel[1])();
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = 1;
    bVar4 = false;
  } while (bVar5);
  InstanceCount = InstanceCount + -1;
  if (InstanceCount == 0) {
    operator_delete(OPL3Data,0x547c0);
    OPL3Data = (OPL3DataStruct *)0x0;
    operator_delete(OperatorData,0x11c00);
    OperatorData = (OperatorDataStruct *)0x0;
  }
  return;
}

Assistant:

OPL3::~OPL3()
{
	ryt = 0;
	setRhythmMode();	// Make sure all operators point to the dynamically allocated ones.
	for (int array = 0; array < 2; array++)
	{
		for (int operatorNumber = 0; operatorNumber < 0x20; operatorNumber++)
		{
			if (operators[array][operatorNumber] != NULL)
			{
				delete operators[array][operatorNumber];
			}
		}
		for (int channelNumber = 0; channelNumber < 9; channelNumber++)
		{
			delete channels2op[array][channelNumber];
		}
		for (int channelNumber = 0; channelNumber < 3; channelNumber++)
		{
			delete channels4op[array][channelNumber];
		}
	}
	if (--InstanceCount == 0)
	{
		delete OPL3Data;
		OPL3Data = NULL;
		delete OperatorData;
		OperatorData = NULL;
	}
}